

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.h
# Opt level: O3

Ptr __thiscall core::image::rescale_half_size_gaussian<float>(image *this,ConstPtr *img,float sigma)

{
  uint uVar1;
  element_type *peVar2;
  long *plVar3;
  pointer pfVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  Image<float> *__p;
  invalid_argument *this_00;
  uint uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  long lVar16;
  long lVar17;
  long lVar18;
  uint uVar19;
  int iVar20;
  pointer pfVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  int iVar28;
  ulong uVar29;
  pointer pfVar30;
  ulong uVar31;
  ulong uVar32;
  pointer pfVar33;
  int iVar34;
  pointer pfVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  Ptr PVar39;
  pointer local_50;
  
  peVar2 = (img->super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  iVar34 = (peVar2->super_TypedImageBase<float>).super_ImageBase.w;
  if (1 < iVar34) {
    iVar7 = (peVar2->super_TypedImageBase<float>).super_ImageBase.h;
    if (1 < iVar7) {
      uVar1 = (peVar2->super_TypedImageBase<float>).super_ImageBase.c;
      __p = (Image<float> *)operator_new(0x30);
      (__p->super_TypedImageBase<float>).super_ImageBase.w = 0;
      (__p->super_TypedImageBase<float>).super_ImageBase.h = 0;
      (__p->super_TypedImageBase<float>).super_ImageBase.c = 0;
      (__p->super_TypedImageBase<float>).data.super__Vector_base<float,_std::allocator<float>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__p->super_TypedImageBase<float>).data.super__Vector_base<float,_std::allocator<float>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__p->super_TypedImageBase<float>).data.super__Vector_base<float,_std::allocator<float>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__p->super_TypedImageBase<float>).super_ImageBase._vptr_ImageBase =
           (_func_int **)&PTR__TypedImageBase_0014db58;
      *(Image<float> **)this = __p;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<core::Image<float>*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),__p);
      plVar3 = *(long **)this;
      (**(code **)(*plVar3 + 0x40))(plVar3);
      uVar9 = iVar34 + 1 >> 1;
      uVar19 = iVar7 + 1 >> 1;
      *(uint *)(plVar3 + 1) = uVar9;
      *(uint *)((long)plVar3 + 0xc) = uVar19;
      *(uint *)(plVar3 + 2) = uVar1;
      std::vector<float,_std::allocator<float>_>::resize
                ((vector<float,_std::allocator<float>_> *)(plVar3 + 3),
                 (long)(int)(uVar1 * uVar9 * uVar19));
      fVar38 = sigma * sigma + sigma * sigma;
      fVar36 = expf(-0.5 / fVar38);
      fVar37 = expf(-2.5 / fVar38);
      fVar38 = expf(-4.5 / fVar38);
      _Var15._M_pi = extraout_RDX;
      if (0 < (int)uVar19) {
        lVar12 = (long)(int)uVar1;
        iVar13 = uVar1 * iVar34;
        pfVar4 = (((img->super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->super_TypedImageBase<float>).data.
                 super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        iVar7 = iVar7 + -1;
        iVar34 = iVar34 + -1;
        iVar11 = 0;
        iVar23 = 1;
        iVar26 = 2;
        _Var15._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        iVar20 = 0;
        local_50 = pfVar4;
        do {
          iVar14 = 1;
          if (1 < iVar11) {
            iVar14 = iVar11;
          }
          iVar22 = iVar7;
          if (iVar23 < iVar7) {
            iVar22 = iVar23;
          }
          iVar25 = iVar7;
          if (iVar26 < iVar7) {
            iVar25 = iVar26;
          }
          if (0 < (int)uVar9) {
            lVar24 = (long)((iVar14 + -1) * iVar13);
            lVar27 = (long)(iVar22 * iVar13);
            lVar16 = (long)(iVar25 * iVar13);
            pfVar21 = pfVar4 + lVar24;
            pfVar30 = pfVar4 + lVar27;
            pfVar35 = pfVar4 + lVar16;
            lVar5 = *(long *)this;
            iVar14 = 2;
            iVar22 = 1;
            iVar25 = 0;
            uVar31 = 0;
            pfVar33 = local_50;
            do {
              iVar10 = iVar34;
              if (iVar14 < iVar34) {
                iVar10 = iVar14;
              }
              iVar8 = iVar34;
              if (iVar22 < iVar34) {
                iVar8 = iVar22;
              }
              iVar28 = 1;
              if (1 < iVar25) {
                iVar28 = iVar25;
              }
              if (0 < (int)uVar1) {
                uVar29 = (ulong)((iVar28 + -1) * uVar1);
                lVar17 = (long)(int)(iVar10 * uVar1);
                lVar18 = (long)(int)(iVar8 * uVar1);
                lVar6 = *(long *)(lVar5 + 0x18);
                uVar32 = 0;
                do {
                  *(float *)((long)iVar20 * 4 + lVar6 + uVar32 * 4) =
                       (pfVar4[lVar16 + lVar17 + uVar32] * fVar38 +
                       pfVar4[lVar16 + lVar18 + uVar32] * fVar37 +
                       pfVar35[uVar32] * fVar37 +
                       pfVar4[lVar16 + uVar29 + uVar32] * fVar38 +
                       pfVar4[lVar27 + lVar17 + uVar32] * fVar37 +
                       pfVar4[lVar27 + lVar18 + uVar32] * fVar36 +
                       pfVar30[uVar32] * fVar36 +
                       pfVar4[lVar27 + uVar29 + uVar32] * fVar37 +
                       local_50[lVar17 + uVar32] * fVar37 +
                       local_50[lVar18 + uVar32] * fVar36 +
                       pfVar33[uVar32] * fVar36 +
                       local_50[uVar29 + uVar32] * fVar37 +
                       pfVar4[lVar24 + lVar17 + uVar32] * fVar38 +
                       pfVar4[lVar24 + lVar18 + uVar32] * fVar37 +
                       pfVar21[uVar32] * fVar37 + pfVar4[lVar24 + uVar29 + uVar32] * fVar38 + 0.0) /
                       (fVar38 + 0.0 + fVar37 + fVar37 + fVar38 + fVar37 + fVar36 + fVar36 + fVar37
                        + fVar37 + fVar36 + fVar36 + fVar37 + fVar38 + fVar37 + fVar37 + fVar38);
                  uVar32 = uVar32 + 1;
                } while (uVar1 != uVar32);
                iVar20 = iVar20 + (int)uVar32;
              }
              uVar31 = uVar31 + 1;
              iVar14 = iVar14 + 2;
              iVar22 = iVar22 + 2;
              pfVar21 = pfVar21 + lVar12 * 2;
              pfVar33 = pfVar33 + lVar12 * 2;
              pfVar30 = pfVar30 + lVar12 * 2;
              pfVar35 = pfVar35 + lVar12 * 2;
              iVar25 = iVar25 + 2;
            } while (uVar31 != uVar9);
          }
          _Var15._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)&(_Var15._M_pi)->_vptr__Sp_counted_base + 1);
          iVar11 = iVar11 + 2;
          local_50 = local_50 + (long)iVar13 * 2;
          iVar23 = iVar23 + 2;
          iVar26 = iVar26 + 2;
        } while (_Var15._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar19);
      }
      PVar39.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var15._M_pi;
      PVar39.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (Ptr)PVar39.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>;
    }
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Invalid input image");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

typename Image<T>::Ptr
rescale_half_size_gaussian (typename Image<T>::ConstPtr img, float sigma)
{
    int const iw = img->width();
    int const ih = img->height();
    int const ic = img->channels();
    int const ow = (iw + 1) >> 1;
    int const oh = (ih + 1) >> 1;

    if (iw < 2 || ih < 2)
        throw std::invalid_argument("Invalid input image");

    typename Image<T>::Ptr out(Image<T>::create());
    out->allocate(ow, oh, ic);

    /*
     * Weights w1 (4 center px), w2 (8 skewed px) and w3 (4 corner px).
     * Weights can be normalized by dividing with (4*w1 + 8*w2 + 4*w3).
     * Since the accumulator is used, normalization is not explicit.
     */
    float const w1 = std::exp(-0.5f / (2.0f * MATH_POW2(sigma)));
    float const w2 = std::exp(-2.5f / (2.0f * MATH_POW2(sigma)));
    float const w3 = std::exp(-4.5f / (2.0f * MATH_POW2(sigma)));

    int outpos = 0;
    int const rowstride = iw * ic;
    for (int y = 0; y < oh; ++y)
    {
        /* Init the four row pointers. */
        int y2 = (int)y << 1;
        T const* row[4];
        row[0] = &img->at(std::max(0, y2 - 1) * rowstride);
        row[1] = &img->at(y2 * rowstride);
        row[2] = &img->at(std::min((int)ih - 1, y2 + 1) * rowstride);
        row[3] = &img->at(std::min((int)ih - 1, y2 + 2) * rowstride);

        for (int x = 0; x < ow; ++x)
        {
            /* Init four pixel positions for each row. */
            int x2 = (int)x << 1;
            int xi[4];
            xi[0] = std::max(0, x2 - 1) * ic;
            xi[1] = x2 * ic;
            xi[2] = std::min((int)iw - 1, x2 + 1) * ic;
            xi[3] = std::min((int)iw - 1, x2 + 2) * ic;

            /* Accumulate 16 values in each channel. */
            for (int c = 0; c < ic; ++c)
            {
                math::Accum<T> accum(T(0));
                accum.add(row[0][xi[0] + c], w3);
                accum.add(row[0][xi[1] + c], w2);
                accum.add(row[0][xi[2] + c], w2);
                accum.add(row[0][xi[3] + c], w3);

                accum.add(row[1][xi[0] + c], w2);
                accum.add(row[1][xi[1] + c], w1);
                accum.add(row[1][xi[2] + c], w1);
                accum.add(row[1][xi[3] + c], w2);

                accum.add(row[2][xi[0] + c], w2);
                accum.add(row[2][xi[1] + c], w1);
                accum.add(row[2][xi[2] + c], w1);
                accum.add(row[2][xi[3] + c], w2);

                accum.add(row[3][xi[0] + c], w3);
                accum.add(row[3][xi[1] + c], w2);
                accum.add(row[3][xi[2] + c], w2);
                accum.add(row[3][xi[3] + c], w3);

                out->at(outpos++) = accum.normalized();
            }
        }
    }

    return out;
}